

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Material.cpp
# Opt level: O1

void __thiscall Assimp::AMFImporter::ParseNode_TexMap(AMFImporter *this,bool pUseOldName)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  CAMFImporter_NodeElement_TexMap *this_00;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  undefined8 extraout_RAX_03;
  undefined8 extraout_RAX_04;
  undefined8 extraout_RAX_05;
  undefined8 extraout_RAX_06;
  undefined8 extraout_RAX_07;
  undefined8 extraout_RAX_08;
  undefined8 extraout_RAX_09;
  undefined8 extraout_RAX_10;
  _List_node_base *p_Var7;
  runtime_error *prVar8;
  undefined1 **ppuVar9;
  undefined7 in_register_00000031;
  uint uVar10;
  char *__end;
  ulong uVar11;
  float fVar12;
  string an;
  string rtexid;
  string atexid;
  string btexid;
  string gtexid;
  string local_118;
  AMFImporter *local_f8;
  string local_f0;
  uint local_cc;
  undefined1 *local_c8;
  long local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined4 extraout_var_00;
  
  local_cc = (uint)CONCAT71(in_register_00000031,pUseOldName);
  local_c8 = &local_b8;
  local_c0 = 0;
  local_b8 = 0;
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  local_a8 = &local_98;
  local_a0 = 0;
  local_98 = 0;
  uVar4 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  local_f8 = this;
  if (0 < (int)uVar4) {
    uVar11 = 0;
    do {
      iVar5 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,uVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,(char *)CONCAT44(extraout_var,iVar5),
                 (allocator<char> *)&local_f0);
      iVar5 = std::__cxx11::string::compare((char *)&local_118);
      if (iVar5 == 0) {
        iVar5 = (*this->mReader->_vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar5);
        ppuVar9 = &local_c8;
LAB_003f2b50:
        pcVar3 = ppuVar9[1];
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)ppuVar9,0,pcVar3,(ulong)__s);
        this = local_f8;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_118);
        if (iVar5 == 0) {
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar5);
          ppuVar9 = &local_50;
          goto LAB_003f2b50;
        }
        iVar5 = std::__cxx11::string::compare((char *)&local_118);
        if (iVar5 == 0) {
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_02,iVar5);
          ppuVar9 = &local_70;
          goto LAB_003f2b50;
        }
        iVar5 = std::__cxx11::string::compare((char *)&local_118);
        if (iVar5 == 0) {
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_03,iVar5);
          ppuVar9 = &local_a8;
          goto LAB_003f2b50;
        }
        Throw_IncorrectAttr(this,&local_118);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      uVar10 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar10;
    } while (uVar4 != uVar10);
  }
  this_00 = (CAMFImporter_NodeElement_TexMap *)operator_new(0xf8);
  CAMFImporter_NodeElement_TexMap::CAMFImporter_NodeElement_TexMap(this_00,this->mNodeElement_Cur);
  if (((local_c0 == 0) && (local_48 == 0)) && (local_68 == 0)) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"ParseNode_TexMap. At least one texture ID must be defined.","")
    ;
    std::runtime_error::runtime_error(prVar8,(string *)&local_118);
    *(undefined ***)prVar8 = &PTR__runtime_error_0082bce0;
    __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  XML_CheckNode_MustHaveChildren(this);
  ParseHelper_Node_Enter(this,(CAMFImporter_NodeElement *)this_00);
  if ((char)local_cc == '\0') {
    local_84 = 0;
    local_7c = 0;
    local_74 = 0;
    local_cc = 0;
    local_78 = 0;
    local_80 = 0;
    do {
      do {
        while( true ) {
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((char)iVar5 == '\0') goto LAB_003f3a7f;
          iVar6 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar6 != 1) break;
          paVar2 = &local_118.field_2;
          local_118._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"utex1","");
          (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar5 = std::__cxx11::string::compare((char *)&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != paVar2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          this = local_f8;
          if (iVar5 == 0) {
            if ((local_cc & 1) != 0) {
              local_118._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"utex1","");
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_f0,"Only one component can be defined.","");
              Throw_MoreThanOnceDefined(this,&local_118,&local_f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != paVar2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
            }
            fVar12 = XML_ReadNode_GetVal_AsFloat(this);
            this_00->TextureCoordinate[0].x = fVar12;
            local_cc = (uint)CONCAT71((int7)((ulong)extraout_RAX_05 >> 8),1);
          }
          else {
            local_118._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"utex2","");
            (*local_f8->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar5 = std::__cxx11::string::compare((char *)&local_118);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != paVar2) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
            this = local_f8;
            if (iVar5 == 0) {
              if ((local_74 & 1) != 0) {
                local_118._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"utex2","");
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_f0,"Only one component can be defined.","");
                Throw_MoreThanOnceDefined(this,&local_118,&local_f0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p,
                                  local_f0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != paVar2) {
                  operator_delete(local_118._M_dataplus._M_p,
                                  local_118.field_2._M_allocated_capacity + 1);
                }
              }
              fVar12 = XML_ReadNode_GetVal_AsFloat(this);
              this_00->TextureCoordinate[1].x = fVar12;
              local_74 = (uint)CONCAT71((int7)((ulong)extraout_RAX_06 >> 8),1);
            }
            else {
              local_118._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"utex3","");
              (*local_f8->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar5 = std::__cxx11::string::compare((char *)&local_118);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != paVar2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
              this = local_f8;
              if (iVar5 == 0) {
                if ((local_78 & 1) != 0) {
                  local_118._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"utex3","");
                  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_f0,"Only one component can be defined.","");
                  Throw_MoreThanOnceDefined(this,&local_118,&local_f0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                    operator_delete(local_f0._M_dataplus._M_p,
                                    local_f0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p != paVar2) {
                    operator_delete(local_118._M_dataplus._M_p,
                                    local_118.field_2._M_allocated_capacity + 1);
                  }
                }
                fVar12 = XML_ReadNode_GetVal_AsFloat(this);
                this_00->TextureCoordinate[2].x = fVar12;
                local_78 = (uint)CONCAT71((int7)((ulong)extraout_RAX_07 >> 8),1);
              }
              else {
                local_118._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"vtex1","");
                (*local_f8->mReader->_vptr_IIrrXMLReader[0xd])();
                iVar5 = std::__cxx11::string::compare((char *)&local_118);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != paVar2) {
                  operator_delete(local_118._M_dataplus._M_p,
                                  local_118.field_2._M_allocated_capacity + 1);
                }
                this = local_f8;
                if (iVar5 == 0) {
                  if ((local_7c & 1) != 0) {
                    local_118._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"vtex1","")
                    ;
                    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_f0,"Only one component can be defined.","");
                    Throw_MoreThanOnceDefined(this,&local_118,&local_f0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                      operator_delete(local_f0._M_dataplus._M_p,
                                      local_f0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_dataplus._M_p != paVar2) {
                      operator_delete(local_118._M_dataplus._M_p,
                                      local_118.field_2._M_allocated_capacity + 1);
                    }
                  }
                  fVar12 = XML_ReadNode_GetVal_AsFloat(this);
                  this_00->TextureCoordinate[0].y = fVar12;
                  local_7c = (uint)CONCAT71((int7)((ulong)extraout_RAX_08 >> 8),1);
                }
                else {
                  local_118._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"vtex2","");
                  (*local_f8->mReader->_vptr_IIrrXMLReader[0xd])();
                  iVar5 = std::__cxx11::string::compare((char *)&local_118);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p != paVar2) {
                    operator_delete(local_118._M_dataplus._M_p,
                                    local_118.field_2._M_allocated_capacity + 1);
                  }
                  this = local_f8;
                  if (iVar5 == 0) {
                    if ((local_80 & 1) != 0) {
                      local_118._M_dataplus._M_p = (pointer)paVar2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_118,"vtex2","");
                      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_f0,"Only one component can be defined.","");
                      Throw_MoreThanOnceDefined(this,&local_118,&local_f0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                        operator_delete(local_f0._M_dataplus._M_p,
                                        local_f0.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_118._M_dataplus._M_p != paVar2) {
                        operator_delete(local_118._M_dataplus._M_p,
                                        local_118.field_2._M_allocated_capacity + 1);
                      }
                    }
                    fVar12 = XML_ReadNode_GetVal_AsFloat(this);
                    this_00->TextureCoordinate[1].y = fVar12;
                    local_80 = (uint)CONCAT71((int7)((ulong)extraout_RAX_09 >> 8),1);
                  }
                  else {
                    local_118._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"vtex3","")
                    ;
                    (*local_f8->mReader->_vptr_IIrrXMLReader[0xd])();
                    iVar5 = std::__cxx11::string::compare((char *)&local_118);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_dataplus._M_p != paVar2) {
                      operator_delete(local_118._M_dataplus._M_p,
                                      local_118.field_2._M_allocated_capacity + 1);
                    }
                    this = local_f8;
                    if (iVar5 == 0) {
                      if ((local_84 & 1) != 0) {
                        local_118._M_dataplus._M_p = (pointer)paVar2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_118,"vtex3","");
                        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_f0,"Only one component can be defined.","");
                        Throw_MoreThanOnceDefined(this,&local_118,&local_f0);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                          operator_delete(local_f0._M_dataplus._M_p,
                                          local_f0.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_118._M_dataplus._M_p != paVar2) {
                          operator_delete(local_118._M_dataplus._M_p,
                                          local_118.field_2._M_allocated_capacity + 1);
                        }
                      }
                      fVar12 = XML_ReadNode_GetVal_AsFloat(this);
                      this_00->TextureCoordinate[2].y = fVar12;
                      local_84 = (uint)CONCAT71((int7)((ulong)extraout_RAX_10 >> 8),1);
                    }
                    else {
                      local_118._M_dataplus._M_p = (pointer)paVar2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_118,"texmap","");
                      this = local_f8;
                      XML_CheckNode_SkipUnsupported(local_f8,&local_118);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_118._M_dataplus._M_p != paVar2) {
                        operator_delete(local_118._M_dataplus._M_p,
                                        local_118.field_2._M_allocated_capacity + 1);
                      }
                    }
                  }
                }
              }
            }
          }
        }
        iVar6 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar6 != 2);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"texmap","");
      (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar6 = std::__cxx11::string::compare((char *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      this = local_f8;
    } while (iVar6 != 0);
    if ((char)iVar5 != '\0') goto LAB_003f3abe;
LAB_003f3a7f:
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"texmap","");
    Throw_CloseNotFound(this,&local_118);
  }
  else {
    local_84 = 0;
    local_7c = 0;
    local_74 = 0;
    local_cc = 0;
    local_78 = 0;
    local_80 = 0;
    do {
      do {
        while( true ) {
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((char)iVar5 == '\0') goto LAB_003f3a48;
          iVar6 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar6 != 1) break;
          paVar2 = &local_118.field_2;
          local_118._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u1","");
          (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar5 = std::__cxx11::string::compare((char *)&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != paVar2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          this = local_f8;
          if (iVar5 == 0) {
            if ((local_cc & 1) != 0) {
              local_118._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u1","");
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_f0,"Only one component can be defined.","");
              Throw_MoreThanOnceDefined(this,&local_118,&local_f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != paVar2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
            }
            fVar12 = XML_ReadNode_GetVal_AsFloat(this);
            this_00->TextureCoordinate[0].x = fVar12;
            local_cc = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          }
          else {
            local_118._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u2","");
            (*local_f8->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar5 = std::__cxx11::string::compare((char *)&local_118);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != paVar2) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
            this = local_f8;
            if (iVar5 == 0) {
              if ((local_74 & 1) != 0) {
                local_118._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u2","");
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_f0,"Only one component can be defined.","");
                Throw_MoreThanOnceDefined(this,&local_118,&local_f0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p,
                                  local_f0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != paVar2) {
                  operator_delete(local_118._M_dataplus._M_p,
                                  local_118.field_2._M_allocated_capacity + 1);
                }
              }
              fVar12 = XML_ReadNode_GetVal_AsFloat(this);
              this_00->TextureCoordinate[1].x = fVar12;
              local_74 = (uint)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
            }
            else {
              local_118._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u3","");
              (*local_f8->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar5 = std::__cxx11::string::compare((char *)&local_118);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != paVar2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
              this = local_f8;
              if (iVar5 == 0) {
                if ((local_78 & 1) != 0) {
                  local_118._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u3","");
                  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_f0,"Only one component can be defined.","");
                  Throw_MoreThanOnceDefined(this,&local_118,&local_f0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                    operator_delete(local_f0._M_dataplus._M_p,
                                    local_f0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p != paVar2) {
                    operator_delete(local_118._M_dataplus._M_p,
                                    local_118.field_2._M_allocated_capacity + 1);
                  }
                }
                fVar12 = XML_ReadNode_GetVal_AsFloat(this);
                this_00->TextureCoordinate[2].x = fVar12;
                local_78 = (uint)CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),1);
              }
              else {
                local_118._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"v1","");
                (*local_f8->mReader->_vptr_IIrrXMLReader[0xd])();
                iVar5 = std::__cxx11::string::compare((char *)&local_118);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != paVar2) {
                  operator_delete(local_118._M_dataplus._M_p,
                                  local_118.field_2._M_allocated_capacity + 1);
                }
                this = local_f8;
                if (iVar5 == 0) {
                  if ((local_7c & 1) != 0) {
                    local_118._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"v1","");
                    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_f0,"Only one component can be defined.","");
                    Throw_MoreThanOnceDefined(this,&local_118,&local_f0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                      operator_delete(local_f0._M_dataplus._M_p,
                                      local_f0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_dataplus._M_p != paVar2) {
                      operator_delete(local_118._M_dataplus._M_p,
                                      local_118.field_2._M_allocated_capacity + 1);
                    }
                  }
                  fVar12 = XML_ReadNode_GetVal_AsFloat(this);
                  this_00->TextureCoordinate[0].y = fVar12;
                  local_7c = (uint)CONCAT71((int7)((ulong)extraout_RAX_02 >> 8),1);
                }
                else {
                  local_118._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"v2","");
                  (*local_f8->mReader->_vptr_IIrrXMLReader[0xd])();
                  iVar5 = std::__cxx11::string::compare((char *)&local_118);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p != paVar2) {
                    operator_delete(local_118._M_dataplus._M_p,
                                    local_118.field_2._M_allocated_capacity + 1);
                  }
                  this = local_f8;
                  if (iVar5 == 0) {
                    if ((local_80 & 1) != 0) {
                      local_118._M_dataplus._M_p = (pointer)paVar2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"v2","");
                      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_f0,"Only one component can be defined.","");
                      Throw_MoreThanOnceDefined(this,&local_118,&local_f0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                        operator_delete(local_f0._M_dataplus._M_p,
                                        local_f0.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_118._M_dataplus._M_p != paVar2) {
                        operator_delete(local_118._M_dataplus._M_p,
                                        local_118.field_2._M_allocated_capacity + 1);
                      }
                    }
                    fVar12 = XML_ReadNode_GetVal_AsFloat(this);
                    this_00->TextureCoordinate[1].y = fVar12;
                    local_80 = (uint)CONCAT71((int7)((ulong)extraout_RAX_03 >> 8),1);
                  }
                  else {
                    local_118._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"v3","");
                    (*local_f8->mReader->_vptr_IIrrXMLReader[0xd])();
                    iVar5 = std::__cxx11::string::compare((char *)&local_118);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_dataplus._M_p != paVar2) {
                      operator_delete(local_118._M_dataplus._M_p,
                                      local_118.field_2._M_allocated_capacity + 1);
                    }
                    this = local_f8;
                    if (iVar5 == 0) {
                      if ((local_84 & 1) != 0) {
                        local_118._M_dataplus._M_p = (pointer)paVar2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_118,"v3","");
                        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_f0,"Only one component can be defined.","");
                        Throw_MoreThanOnceDefined(this,&local_118,&local_f0);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                          operator_delete(local_f0._M_dataplus._M_p,
                                          local_f0.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_118._M_dataplus._M_p != paVar2) {
                          operator_delete(local_118._M_dataplus._M_p,
                                          local_118.field_2._M_allocated_capacity + 1);
                        }
                      }
                      fVar12 = XML_ReadNode_GetVal_AsFloat(this);
                      this_00->TextureCoordinate[2].y = fVar12;
                      local_84 = (uint)CONCAT71((int7)((ulong)extraout_RAX_04 >> 8),1);
                    }
                    else {
                      local_118._M_dataplus._M_p = (pointer)paVar2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"map","")
                      ;
                      this = local_f8;
                      XML_CheckNode_SkipUnsupported(local_f8,&local_118);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_118._M_dataplus._M_p != paVar2) {
                        operator_delete(local_118._M_dataplus._M_p,
                                        local_118.field_2._M_allocated_capacity + 1);
                      }
                    }
                  }
                }
              }
            }
          }
        }
        iVar6 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar6 != 2);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"map","");
      (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar6 = std::__cxx11::string::compare((char *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      this = local_f8;
    } while (iVar6 != 0);
    if ((char)iVar5 != '\0') goto LAB_003f3abe;
LAB_003f3a48:
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"map","");
    Throw_CloseNotFound(this,&local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
LAB_003f3abe:
  ParseHelper_Node_Exit(this);
  if (((((local_cc & 1) != 0) && ((local_74 & 1) != 0)) &&
      (((local_78 & 1) != 0 && (((local_7c & 1) != 0 && ((local_80 & 1) != 0)))))) &&
     ((local_84 & 1) != 0)) {
    std::__cxx11::string::_M_assign((string *)&this_00->TextureID_R);
    std::__cxx11::string::_M_assign((string *)&this_00->TextureID_G);
    std::__cxx11::string::_M_assign((string *)&this_00->TextureID_B);
    std::__cxx11::string::_M_assign((string *)&this_00->TextureID_A);
    p_Var7 = (_List_node_base *)operator_new(0x18);
    p_Var7[1]._M_next = (_List_node_base *)this_00;
    std::__detail::_List_node_base::_M_hook(p_Var7);
    psVar1 = &(this->mNodeElement_List).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (local_a8 != &local_98) {
      operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
    }
    return;
  }
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"Not all texture coordinates are defined.","");
  std::runtime_error::runtime_error(prVar8,(string *)&local_118);
  *(undefined ***)prVar8 = &PTR__runtime_error_0082bce0;
  __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AMFImporter::ParseNode_TexMap(const bool pUseOldName) {
    std::string rtexid, gtexid, btexid, atexid;

	// Read attributes for node <color>.
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("rtexid", rtexid, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("gtexid", gtexid, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("btexid", btexid, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("atexid", atexid, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND;

	// create new texture coordinates object.
    CAMFImporter_NodeElement *ne = new CAMFImporter_NodeElement_TexMap(mNodeElement_Cur);

	CAMFImporter_NodeElement_TexMap& als = *((CAMFImporter_NodeElement_TexMap*)ne);// alias for convenience
	// check data
	if(rtexid.empty() && gtexid.empty() && btexid.empty()) throw DeadlyImportError("ParseNode_TexMap. At least one texture ID must be defined.");
	// Check for children nodes
	XML_CheckNode_MustHaveChildren();
	// read children nodes
	bool read_flag[6] = { false, false, false, false, false, false };

	ParseHelper_Node_Enter(ne);
	if(!pUseOldName)
	{
		MACRO_NODECHECK_LOOPBEGIN("texmap");
			MACRO_NODECHECK_READCOMP_F("utex1", read_flag[0], als.TextureCoordinate[0].x);
			MACRO_NODECHECK_READCOMP_F("utex2", read_flag[1], als.TextureCoordinate[1].x);
			MACRO_NODECHECK_READCOMP_F("utex3", read_flag[2], als.TextureCoordinate[2].x);
			MACRO_NODECHECK_READCOMP_F("vtex1", read_flag[3], als.TextureCoordinate[0].y);
			MACRO_NODECHECK_READCOMP_F("vtex2", read_flag[4], als.TextureCoordinate[1].y);
			MACRO_NODECHECK_READCOMP_F("vtex3", read_flag[5], als.TextureCoordinate[2].y);
		MACRO_NODECHECK_LOOPEND("texmap");
	}
	else
	{
		MACRO_NODECHECK_LOOPBEGIN("map");
			MACRO_NODECHECK_READCOMP_F("u1", read_flag[0], als.TextureCoordinate[0].x);
			MACRO_NODECHECK_READCOMP_F("u2", read_flag[1], als.TextureCoordinate[1].x);
			MACRO_NODECHECK_READCOMP_F("u3", read_flag[2], als.TextureCoordinate[2].x);
			MACRO_NODECHECK_READCOMP_F("v1", read_flag[3], als.TextureCoordinate[0].y);
			MACRO_NODECHECK_READCOMP_F("v2", read_flag[4], als.TextureCoordinate[1].y);
			MACRO_NODECHECK_READCOMP_F("v3", read_flag[5], als.TextureCoordinate[2].y);
		MACRO_NODECHECK_LOOPEND("map");
	}// if(!pUseOldName) else

	ParseHelper_Node_Exit();

	// check that all components was defined
	if(!(read_flag[0] && read_flag[1] && read_flag[2] && read_flag[3] && read_flag[4] && read_flag[5]))
		throw DeadlyImportError("Not all texture coordinates are defined.");

	// copy attributes data
	als.TextureID_R = rtexid;
	als.TextureID_G = gtexid;
	als.TextureID_B = btexid;
	als.TextureID_A = atexid;

	mNodeElement_List.push_back(ne);// add to node element list because its a new object in graph.
}